

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12cdf1::CBBTest_StickyError_Test::TestBody(CBBTest_StickyError_Test *this)

{
  int iVar1;
  char *in_R9;
  AssertHelper AStack_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  size_t len;
  uint8_t *ptr;
  string local_a8;
  AssertionResult gtest_ar_;
  uint8_t buf;
  ScopedCBB cbb;
  CBB child;
  
  CBB_zero(&cbb.ctx_);
  iVar1 = CBB_init(&cbb.ctx_,0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&ptr);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)"CBB_init(cbb.get(), 0)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&len,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4c0,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&ptr);
LAB_001fb266:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = CBB_add_u8_length_prefixed(&cbb.ctx_,&child);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&ptr);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&gtest_ar_,
                 (AssertionResult *)"CBB_add_u8_length_prefixed(cbb.get(), &child)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c1,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&ptr);
      goto LAB_001fb266;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = CBB_add_bytes(&child,"",0x100);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&ptr);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&gtest_ar_,
                 (AssertionResult *)"CBB_add_bytes(&child, kZeros, sizeof(kZeros))","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c2,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&ptr);
      goto LAB_001fb266;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = CBB_flush(&cbb.ctx_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&ptr);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)"CBB_flush(cbb.get())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c3,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&ptr);
      goto LAB_001fb266;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = CBB_add_u8(&cbb.ctx_,'\0');
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c8,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = CBB_finish(&cbb.ctx_,&ptr,&len);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&gtest_ar_,
                 (AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c9,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::Reset(&cbb);
    iVar1 = CBB_init_fixed(&cbb.ctx_,&buf,1);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&gtest_ar_,
                 (AssertionResult *)"CBB_init_fixed(cbb.get(), &buf, 1)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4ce,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = CBB_add_bytes(&cbb.ctx_,"",0x100);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 == 0;
      if (gtest_ar_.success_) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = CBB_add_u8(&cbb.ctx_,'\0');
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d2,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
          std::__cxx11::string::~string((string *)&local_a8);
          if (local_c0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c0._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = CBB_finish(&cbb.ctx_,&ptr,&len);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,(internal *)&gtest_ar_,
                     (AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d3,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
          std::__cxx11::string::~string((string *)&local_a8);
          if (local_c0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c0._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::Reset(&cbb);
        iVar1 = CBB_init(&cbb.ctx_,0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,(internal *)&gtest_ar_,(AssertionResult *)"CBB_init(cbb.get(), 0)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d7,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          iVar1 = CBB_add_u24(&cbb.ctx_,0x1000000);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar1 == 0;
          if (gtest_ar_.success_) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar1 = CBB_add_u8(&cbb.ctx_,'\0');
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar1 == 0;
            if (!gtest_ar_.success_) {
              testing::Message::Message((Message *)&local_c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_a8,(internal *)&gtest_ar_,
                         (AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&AStack_c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x4db,local_a8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
              testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
              std::__cxx11::string::~string((string *)&local_a8);
              if (local_c0._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_c0._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            iVar1 = CBB_finish(&cbb.ctx_,&ptr,&len);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar1 == 0;
            if (gtest_ar_.success_) goto LAB_001fb28a;
            testing::Message::Message((Message *)&local_c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a8,(internal *)&gtest_ar_,
                       (AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4dc,local_a8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
          }
          else {
            testing::Message::Message((Message *)&local_c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a8,(internal *)&gtest_ar_,
                       (AssertionResult *)"CBB_add_u24(cbb.get(), 1u << 24)","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4d8,local_a8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,(internal *)&gtest_ar_,
                   (AssertionResult *)"CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros))","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x4cf,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    ptr = (uint8_t *)local_c0._M_head_impl;
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)ptr !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)ptr + 8))();
  }
LAB_001fb28a:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  return;
}

Assistant:

TEST(CBBTest, StickyError) {
  // Write an input that exceeds the limit for its length prefix.
  bssl::ScopedCBB cbb;
  CBB child;
  static const uint8_t kZeros[256] = {0};
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_TRUE(CBB_add_u8_length_prefixed(cbb.get(), &child));
  ASSERT_TRUE(CBB_add_bytes(&child, kZeros, sizeof(kZeros)));
  ASSERT_FALSE(CBB_flush(cbb.get()));

  // All future operations should fail.
  uint8_t *ptr;
  size_t len;
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write an input that cannot fit in a fixed CBB.
  cbb.Reset();
  uint8_t buf;
  ASSERT_TRUE(CBB_init_fixed(cbb.get(), &buf, 1));
  ASSERT_FALSE(CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros)));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write a u32 that cannot fit in a u24.
  cbb.Reset();
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_FALSE(CBB_add_u24(cbb.get(), 1u << 24));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));
}